

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O0

size_t tinyusdz::Usd_IntegerCompression64::DecompressFromBuffer
                 (char *compressed,size_t compressedSize,uint64_t *ints,size_t numInts,string *err,
                 char *workingSpace)

{
  size_t sVar1;
  char *workingSpace_local;
  string *err_local;
  size_t numInts_local;
  uint64_t *ints_local;
  size_t compressedSize_local;
  char *compressed_local;
  
  sVar1 = anon_unknown_0::_DecompressIntegers<unsigned_long>
                    (compressed,compressedSize,ints,numInts,err,workingSpace);
  return sVar1;
}

Assistant:

size_t
Usd_IntegerCompression64::DecompressFromBuffer(
    char const *compressed, size_t compressedSize,
    uint64_t *ints, size_t numInts, std::string *err, char *workingSpace)
{
    return _DecompressIntegers(compressed, compressedSize,
                               ints, numInts, err, workingSpace);
}